

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall glu::sl::ShaderParser::assumeToken(ShaderParser *this,Token token)

{
  char *__rhs;
  undefined8 extraout_RAX;
  ShaderParser *this_00;
  allocator<char> local_da;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->m_curToken == token) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"unexpected token \'",&local_d9);
  std::operator+(&local_d8,&local_38,&this->m_curTokenStr);
  this_00 = (ShaderParser *)local_b8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_d8,"\', expecting \'");
  __rhs = getTokenName(this_00,token);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b8 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,__rhs
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b8 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b8 + 0x20),"\'");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,local_78._M_dataplus._M_p,&local_da);
  parseError(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)(local_b8 + 0x40));
  std::__cxx11::string::~string((string *)(local_b8 + 0x20));
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::assumeToken (Token token)
{
	if (m_curToken != token)
		parseError((string("unexpected token '") + m_curTokenStr + "', expecting '" + getTokenName(token) + "'").c_str());
	DE_TEST_ASSERT(m_curToken == token);
}